

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::CheckHoleLinkages2(Clipper *this,OutRec *outRec1,OutRec *outRec2)

{
  pointer ppOVar1;
  OutRec *pOVar2;
  size_type i;
  
  for (i = 0; ppOVar1 = (this->m_PolyOuts).
                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
      i < (ulong)((long)(this->m_PolyOuts).
                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3); i = i + 1)
  {
    pOVar2 = ppOVar1[i];
    if (((pOVar2->isHole == true) && (pOVar2->bottomPt != (OutPt *)0x0)) &&
       (pOVar2->FirstLeft == outRec2)) {
      pOVar2->FirstLeft = outRec1;
    }
  }
  return;
}

Assistant:

void Clipper::CheckHoleLinkages2(OutRec *outRec1, OutRec *outRec2)
{
  //if a hole is owned by outRec2 then make it owned by outRec1 ...
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    if (m_PolyOuts[i]->isHole && m_PolyOuts[i]->bottomPt &&
      m_PolyOuts[i]->FirstLeft == outRec2)
        m_PolyOuts[i]->FirstLeft = outRec1;
}